

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gls::BuiltinPrecisionTests::InputLess<tcu::Matrix<float,_2,_3>_>::operator()
          (InputLess<tcu::Matrix<float,_2,_3>_> *this,Matrix<float,_2,_3> *mat1,
          Matrix<float,_2,_3> *mat2)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar1 = inputLess<tcu::Vector<float,2>>((Vector<float,_2> *)mat1,(Vector<float,_2> *)mat2);
  bVar3 = true;
  if (!bVar1) {
    uVar2 = 0;
    do {
      bVar1 = inputLess<tcu::Vector<float,2>>((Vector<float,_2> *)mat2,(Vector<float,_2> *)mat1);
      if (bVar1) {
        bVar1 = false;
        goto LAB_01756132;
      }
      bVar3 = uVar2 < 2;
      if (uVar2 == 2) goto LAB_01756132;
      mat1 = (Matrix<float,_2,_3> *)((long)mat1 + 8);
      mat2 = (Matrix<float,_2,_3> *)((long)mat2 + 8);
      bVar1 = inputLess<tcu::Vector<float,2>>((Vector<float,_2> *)mat1,(Vector<float,_2> *)mat2);
      uVar2 = uVar2 + 1;
    } while (!bVar1);
    bVar1 = true;
LAB_01756132:
    bVar3 = (bool)(bVar3 & bVar1);
  }
  return bVar3;
}

Assistant:

bool operator() (const Matrix<T, Rows, Cols>& mat1,
					 const Matrix<T, Rows, Cols>& mat2) const
	{
		for (int col = 0; col < Cols; ++col)
		{
			if (inputLess(mat1[col], mat2[col]))
				return true;
			if (inputLess(mat2[col], mat1[col]))
				return false;
		}

		return false;
	}